

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

void gost_magma_encrypt_wrap(uchar *in,uchar *out,ossl_gost_cipher_ctx *c)

{
  long in_RSI;
  long in_RDI;
  uchar d [8];
  uchar b [8];
  int i;
  byte *in_stack_ffffffffffffffd0;
  byte *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 8; iVar1 = iVar1 + 1) {
    (&stack0xffffffffffffffdc)[7 - iVar1] = *(undefined1 *)(in_RDI + iVar1);
  }
  gostcrypt((gost_ctx *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
            in_stack_ffffffffffffffd0);
  for (iVar1 = 0; iVar1 < 8; iVar1 = iVar1 + 1) {
    *(undefined1 *)(in_RSI + (7 - iVar1)) = (&stack0xffffffffffffffd4)[iVar1];
  }
  return;
}

Assistant:

void gost_magma_encrypt_wrap(unsigned char *in, unsigned char *out,
                   struct ossl_gost_cipher_ctx *c) {
    int i;
    unsigned char b[8];
    unsigned char d[8];
    for (i = 0; i < 8; i++) {
        b[7 - i] = in[i];
    }
    gostcrypt(&(c->cctx), b, d);
    for (i = 0; i < 8; i++) {
        out[7 - i] = d[i];
    }
}